

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

void __thiscall Matrix4f::transpose(Matrix4f *this)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = 0xc;
  lVar3 = 0;
  do {
    lVar3 = lVar3 + 1;
    lVar4 = 0;
    do {
      fVar1 = *(float *)((long)this + (lVar4 + 4) * 4);
      *(float *)((long)this + (lVar4 + 4) * 4) = *(float *)((long)this + lVar4 + 4);
      *(float *)((long)this + lVar4 + 4) = fVar1;
      lVar4 = lVar4 + 4;
    } while (lVar2 != lVar4);
    this = (Matrix4f *)((long)this + 0x14);
    lVar2 = lVar2 + -4;
  } while (lVar3 != 3);
  return;
}

Assistant:

void Matrix4f::transpose()
{
	float temp;

	for( int i = 0; i < 3; ++i )
	{
		for( int j = i + 1; j < 4; ++j )
		{
			temp = ( *this )( i, j );
			( * this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}